

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

DisasJumpType op_rchp(DisasContext_conflict13 *s,DisasOps *o)

{
  TCGContext_conflict12 *tcg_ctx;
  TCGTemp *local_18;
  TCGv_i64 local_10;
  
  tcg_ctx = s->uc->tcg_ctx;
  local_18 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
  local_10 = tcg_ctx->regs[1] + (long)tcg_ctx;
  tcg_gen_callN_s390x(tcg_ctx,helper_rchp,(TCGTemp *)0x0,2,&local_18);
  set_cc_static(s);
  return DISAS_NEXT;
}

Assistant:

static DisasJumpType op_rchp(DisasContext *s, DisasOps *o)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    gen_helper_rchp(tcg_ctx, tcg_ctx->cpu_env, tcg_ctx->regs[1]);
    set_cc_static(s);
    return DISAS_NEXT;
}